

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

string * __thiscall
yy::parser::yysyntax_error__abi_cxx11_(string *__return_storage_ptr__,parser *this,context *yyctx)

{
  int iVar1;
  undefined *extraout_RDX;
  undefined *puVar2;
  undefined *extraout_RDX_00;
  undefined *extraout_RDX_01;
  long lVar3;
  char *pcVar4;
  symbol_kind_type yyarg [5];
  string local_48;
  
  iVar1 = yy_syntax_error_arguments_((parser *)__return_storage_ptr__,yyctx,yyarg,5);
  if (iVar1 - 1U < 5) {
    puVar2 = &DAT_0010c854;
    pcVar4 = &DAT_0010c854 + *(int *)(&DAT_0010c854 + (ulong)(iVar1 - 1U) * 4);
  }
  else {
    pcVar4 = "syntax error";
    puVar2 = extraout_RDX;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar3 = 0;
  do {
    if (*pcVar4 == '%') {
      if (lVar3 >= iVar1 || pcVar4[1] != 's') goto LAB_00105bc0;
      symbol_name_abi_cxx11_
                (&local_48,(parser *)(ulong)(uint)yyarg[lVar3],
                 (symbol_kind_type)
                 CONCAT71((int7)((ulong)puVar2 >> 8),lVar3 < iVar1 && pcVar4[1] == 's'));
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      pcVar4 = pcVar4 + 1;
      lVar3 = lVar3 + 1;
      std::__cxx11::string::~string((string *)&local_48);
      puVar2 = extraout_RDX_00;
    }
    else {
      if (*pcVar4 == '\0') {
        return __return_storage_ptr__;
      }
LAB_00105bc0:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      puVar2 = extraout_RDX_01;
    }
    pcVar4 = pcVar4 + 1;
  } while( true );
}

Assistant:

std::string
  parser::yysyntax_error_ (const context& yyctx) const
  {
    // Its maximum.
    enum { YYARGS_MAX = 5 };
    // Arguments of yyformat.
    symbol_kind_type yyarg[YYARGS_MAX];
    int yycount = yy_syntax_error_arguments_ (yyctx, yyarg, YYARGS_MAX);

    char const* yyformat = YY_NULLPTR;
    switch (yycount)
      {
#define YYCASE_(N, S)                         \
        case N:                               \
          yyformat = S;                       \
        break
      default: // Avoid compiler warnings.
        YYCASE_ (0, YY_("syntax error"));
        YYCASE_ (1, YY_("syntax error, unexpected %s"));
        YYCASE_ (2, YY_("syntax error, unexpected %s, expecting %s"));
        YYCASE_ (3, YY_("syntax error, unexpected %s, expecting %s or %s"));
        YYCASE_ (4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
        YYCASE_ (5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
      }

    std::string yyres;
    // Argument number.
    std::ptrdiff_t yyi = 0;
    for (char const* yyp = yyformat; *yyp; ++yyp)
      if (yyp[0] == '%' && yyp[1] == 's' && yyi < yycount)
        {
          yyres += symbol_name (yyarg[yyi++]);
          ++yyp;
        }
      else
        yyres += *yyp;
    return yyres;
  }